

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  long lVar3;
  KeyValue *pKVar4;
  size_t minimum_new_capacity;
  KeyValue *pKVar5;
  
  if (this->flat_capacity_ < 0x101) {
    pKVar5 = (this->map_).flat;
    if (other->flat_capacity_ < 0x101) {
      pKVar1 = pKVar5 + this->flat_size_;
      pKVar2 = (other->map_).flat;
      pKVar4 = pKVar2 + other->flat_size_;
      if (other->flat_size_ == 0 || this->flat_size_ == 0) {
        lVar3 = 0;
      }
      else {
        lVar3 = 0;
        do {
          if (pKVar5->first < pKVar2->first) {
            pKVar5 = pKVar5 + 1;
          }
          else {
            if (pKVar5->first == pKVar2->first) {
              pKVar5 = pKVar5 + 1;
            }
            pKVar2 = pKVar2 + 1;
          }
          lVar3 = lVar3 + 1;
        } while ((pKVar5 != pKVar1) && (pKVar2 != pKVar4));
      }
      minimum_new_capacity =
           ((long)pKVar4 - (long)pKVar2 >> 5) + lVar3 + ((long)pKVar1 - (long)pKVar5 >> 5);
    }
    else {
      pKVar2 = flat_end(this);
      minimum_new_capacity =
           (anonymous_namespace)::
           SizeOfUnion<google::protobuf::internal::ExtensionSet::KeyValue*,std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                     (pKVar5,pKVar2,(_Base_ptr)(((other->map_).flat)->second).descriptor,
                      (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                       )&((other->map_).flat)->second);
    }
    GrowCapacity(this,minimum_new_capacity);
  }
  pKVar5 = (other->map_).flat;
  if (0x100 < other->flat_capacity_) {
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::MergeFrom(google::protobuf::internal::ExtensionSet_const&)::__0>
              ((_Base_ptr)(pKVar5->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar5->second,(anon_class_8_1_8991fb9c)this);
    return;
  }
  if (other->flat_size_ != 0) {
    pKVar2 = pKVar5 + other->flat_size_;
    do {
      InternalExtensionMergeFrom(this,pKVar5->first,&pKVar5->second);
      pKVar5 = pKVar5 + 1;
    } while (pKVar5 != pKVar2);
  }
  return;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  if (PROTOBUF_PREDICT_TRUE(!is_large())) {
    if (PROTOBUF_PREDICT_TRUE(!other.is_large())) {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(), other.flat_begin(),
                               other.flat_end()));
    } else {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(),
                               other.map_.large->begin(),
                               other.map_.large->end()));
    }
  }
  other.ForEach([this](int number, const Extension& ext) {
    this->InternalExtensionMergeFrom(number, ext);
  });
}